

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O0

void source(char *src)

{
  int iVar1;
  RFile *f_00;
  time_t start;
  char *pcVar2;
  int local_1080;
  int k;
  int j;
  char transbuf [4096];
  char *local_70;
  char *p;
  time_t stat_lasttime;
  time_t stat_starttime;
  uint64_t stat_bytes;
  uint64_t i;
  int attr;
  RFile *f;
  char *last;
  long permissions;
  unsigned_long atime;
  unsigned_long mtime;
  uint64_t size;
  char *src_local;
  
  size = (uint64_t)src;
  iVar1 = file_type(src);
  if ((iVar1 == 0) || (iVar1 == 3)) {
    pcVar2 = "No such";
    if (iVar1 == 3) {
      pcVar2 = "Not a";
    }
    run_err("%s: %s file or directory",size,pcVar2);
  }
  else if (iVar1 == 2) {
    if ((recursive & 1U) == 0) {
      run_err("%s: not a regular file",size);
    }
    else {
      local_70 = strrchr((char *)size,0x2f);
      if (local_70 == (char *)0x0) {
        local_70 = strrchr((char *)size,0x5c);
      }
      if (local_70 == (char *)0x0) {
        local_70 = (char *)size;
      }
      else {
        local_70 = local_70 + 1;
      }
      iVar1 = strcmp(local_70,".");
      if ((iVar1 != 0) && (iVar1 = strcmp(local_70,".."), iVar1 != 0)) {
        rsource((char *)size);
      }
    }
  }
  else {
    pcVar2 = strrchr((char *)size,0x2f);
    if (pcVar2 == (char *)0x0) {
      f = (RFile *)size;
    }
    else {
      f = (RFile *)(pcVar2 + 1);
    }
    pcVar2 = strrchr((char *)f,0x5c);
    if (pcVar2 != (char *)0x0) {
      pcVar2 = strrchr((char *)f,0x5c);
      f = (RFile *)(pcVar2 + 1);
    }
    if ((f == (RFile *)size) && (pcVar2 = strchr((char *)size,0x3a), pcVar2 != (char *)0x0)) {
      pcVar2 = strchr((char *)size,0x3a);
      f = (RFile *)(pcVar2 + 1);
    }
    f_00 = open_existing_file((char *)size,&mtime,&atime,(unsigned_long *)&permissions,(long *)&last
                             );
    if (f_00 == (RFile *)0x0) {
      run_err("%s: Cannot open file",size);
    }
    else if (((preserve & 1U) == 0) || (iVar1 = scp_send_filetimes(atime,permissions), iVar1 == 0))
    {
      if ((verbose & 1U) != 0) {
        tell_user(_stderr,"Sending file %s, size=%lu",f,mtime);
      }
      iVar1 = scp_send_filename((char *)f,mtime,(int)last);
      if (iVar1 == 0) {
        stat_starttime = 0;
        start = time((time_t *)0x0);
        p = (char *)0x0;
        for (stat_bytes = 0; stat_bytes < mtime; stat_bytes = stat_bytes + 0x1000) {
          local_1080 = 0x1000;
          if (mtime < stat_bytes + 0x1000) {
            local_1080 = (int)mtime - (int)stat_bytes;
          }
          iVar1 = read_from_file(f_00,&k,local_1080);
          if (iVar1 != local_1080) {
            bump("%s: Read error",size);
          }
          iVar1 = scp_send_filedata((char *)&k,local_1080);
          if (iVar1 != 0) {
            bump("%s: Network error occurred",size);
          }
          if ((statistics & 1U) != 0) {
            stat_starttime = local_1080 + stat_starttime;
            pcVar2 = (char *)time((time_t *)0x0);
            if ((pcVar2 != p) || (stat_bytes + (long)local_1080 == mtime)) {
              p = (char *)time((time_t *)0x0);
              print_stats((char *)f,mtime,stat_starttime,start,(time_t)p);
            }
          }
        }
        close_rfile(f_00);
        scp_send_finish();
      }
      else {
        close_rfile(f_00);
      }
    }
    else {
      close_rfile(f_00);
    }
  }
  return;
}

Assistant:

static void source(const char *src)
{
    uint64_t size;
    unsigned long mtime, atime;
    long permissions;
    const char *last;
    RFile *f;
    int attr;
    uint64_t i;
    uint64_t stat_bytes;
    time_t stat_starttime, stat_lasttime;

    attr = file_type(src);
    if (attr == FILE_TYPE_NONEXISTENT ||
        attr == FILE_TYPE_WEIRD) {
        run_err("%s: %s file or directory", src,
                (attr == FILE_TYPE_WEIRD ? "Not a" : "No such"));
        return;
    }

    if (attr == FILE_TYPE_DIRECTORY) {
        if (recursive) {
            /*
             * Avoid . and .. directories.
             */
            const char *p;
            p = strrchr(src, '/');
            if (!p)
                p = strrchr(src, '\\');
            if (!p)
                p = src;
            else
                p++;
            if (!strcmp(p, ".") || !strcmp(p, ".."))
                /* skip . and .. */ ;
            else
                rsource(src);
        } else {
            run_err("%s: not a regular file", src);
        }
        return;
    }

    if ((last = strrchr(src, '/')) == NULL)
        last = src;
    else
        last++;
    if (strrchr(last, '\\') != NULL)
        last = strrchr(last, '\\') + 1;
    if (last == src && strchr(src, ':') != NULL)
        last = strchr(src, ':') + 1;

    f = open_existing_file(src, &size, &mtime, &atime, &permissions);
    if (f == NULL) {
        run_err("%s: Cannot open file", src);
        return;
    }
    if (preserve) {
        if (scp_send_filetimes(mtime, atime)) {
            close_rfile(f);
            return;
        }
    }

    if (verbose) {
        tell_user(stderr, "Sending file %s, size=%"PRIu64, last, size);
    }
    if (scp_send_filename(last, size, permissions)) {
        close_rfile(f);
        return;
    }

    stat_bytes = 0;
    stat_starttime = time(NULL);
    stat_lasttime = 0;

#define PSCP_SEND_BLOCK 4096
    for (i = 0; i < size; i += PSCP_SEND_BLOCK) {
        char transbuf[PSCP_SEND_BLOCK];
        int j, k = PSCP_SEND_BLOCK;

        if (i + k > size)
            k = size - i;
        if ((j = read_from_file(f, transbuf, k)) != k) {
            bump("%s: Read error", src);
        }
        if (scp_send_filedata(transbuf, k))
            bump("%s: Network error occurred", src);

        if (statistics) {
            stat_bytes += k;
            if (time(NULL) != stat_lasttime || i + k == size) {
                stat_lasttime = time(NULL);
                print_stats(last, size, stat_bytes,
                            stat_starttime, stat_lasttime);
            }
        }

    }
    close_rfile(f);

    (void) scp_send_finish();
}